

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdial.cpp
# Opt level: O0

void QDial::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qreal *pqVar1;
  bool bVar2;
  int iVar3;
  QDial *pQVar4;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  qreal qVar5;
  QDial *unaff_retaddr;
  void *_v_1;
  void *_v;
  QDial *_t;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  QDial *in_stack_ffffffffffffffd0;
  
  if (in_ESI == 0) {
    bVar2 = SUB41(in_EDX >> 0x18,0);
    in_stack_ffffffffffffffcc = in_EDX;
    if (in_EDX == 0) {
      setNotchesVisible(in_stack_ffffffffffffffd0,bVar2);
    }
    else if (in_EDX == 1) {
      setWrapping(in_stack_ffffffffffffffd0,bVar2);
    }
  }
  if (in_ESI == 1) {
    pqVar1 = (qreal *)*in_RCX;
    pQVar4 = (QDial *)(ulong)in_EDX;
    switch(pQVar4) {
    case (QDial *)0x0:
      bVar2 = wrapping(pQVar4);
      *(bool *)pqVar1 = bVar2;
      break;
    case (QDial *)0x1:
      iVar3 = notchSize(unaff_retaddr);
      *(int *)pqVar1 = iVar3;
      break;
    case (QDial *)0x2:
      qVar5 = notchTarget(pQVar4);
      *pqVar1 = qVar5;
      break;
    case (QDial *)0x3:
      bVar2 = notchesVisible(pQVar4);
      *(bool *)pqVar1 = bVar2;
    }
  }
  if (in_ESI == 2) {
    pQVar4 = (QDial *)*in_RCX;
    bVar2 = SUB41(in_stack_ffffffffffffffcc >> 0x18,0);
    if (in_EDX == 0) {
      setWrapping(pQVar4,bVar2);
    }
    else if (in_EDX == 2) {
      setNotchTarget(pQVar4,(double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else if (in_EDX == 3) {
      setNotchesVisible(pQVar4,bVar2);
    }
  }
  return;
}

Assistant:

void QDial::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDial *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->setNotchesVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setWrapping((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->notchSize(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->notchTarget(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->notchesVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNotchTarget(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setNotchesVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}